

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixBoundsPS::FixBoundsPS
          (FixBoundsPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,shared_ptr<soplex::Tolerances> *tols)

{
  uint *puVar1;
  pointer pnVar2;
  pointer pnVar3;
  bool bVar4;
  type_conflict5 tVar5;
  double *pdVar6;
  SPxInternalCodeException *this_00;
  VarStatus VVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_150;
  cpp_dec_float<50U,_int,_void> local_140;
  cpp_dec_float<50U,_int,_void> local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_60;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_150,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"FixBounds",(shared_ptr<soplex::Tolerances> *)&local_150,
                     (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum,
                     (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_00337c48;
  this->m_j = j;
  pnVar2 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_188.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar2[j].m_backend.data._M_elems + 8);
  local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[j].m_backend.data;
  local_188.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar2[j].m_backend.data._M_elems + 2);
  puVar1 = pnVar2[j].m_backend.data._M_elems + 4;
  local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_188.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_188.m_backend.exp = pnVar2[j].m_backend.exp;
  local_188.m_backend.neg = pnVar2[j].m_backend.neg;
  local_188.m_backend.fpclass = pnVar2[j].m_backend.fpclass;
  local_188.m_backend.prec_elem = pnVar2[j].m_backend.prec_elem;
  pnVar2 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar2[j].m_backend.data._M_elems + 8);
  local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[j].m_backend.data;
  local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar2[j].m_backend.data._M_elems + 2);
  puVar1 = pnVar2[j].m_backend.data._M_elems + 4;
  local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_1c8.m_backend.exp = pnVar2[j].m_backend.exp;
  local_1c8.m_backend.neg = pnVar2[j].m_backend.neg;
  local_1c8.m_backend.fpclass = pnVar2[j].m_backend.fpclass;
  local_1c8.m_backend.prec_elem = pnVar2[j].m_backend.prec_elem;
  PostStep::feastol(&local_60,&this->super_PostStep);
  bVar4 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_188,&local_1c8,&local_60);
  if (bVar4) {
    VVar7 = FIXED;
  }
  else {
    local_208.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_208.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
    local_208.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_208.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    local_208.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_208.m_backend.exp = (val->m_backend).exp;
    local_208.m_backend.neg = (val->m_backend).neg;
    local_208.m_backend.fpclass = (val->m_backend).fpclass;
    local_208.m_backend.prec_elem = (val->m_backend).prec_elem;
    pnVar3 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_248.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar3[j].m_backend.data._M_elems + 8);
    pnVar2 = pnVar3 + j;
    local_248.m_backend.data._M_elems[0] = (pnVar2->m_backend).data._M_elems[0];
    local_248.m_backend.data._M_elems[1] = (pnVar2->m_backend).data._M_elems[1];
    local_248.m_backend.data._M_elems[2] = (pnVar2->m_backend).data._M_elems[2];
    local_248.m_backend.data._M_elems[3] = (pnVar2->m_backend).data._M_elems[3];
    puVar1 = pnVar3[j].m_backend.data._M_elems + 4;
    local_248.m_backend.data._M_elems[4] = *puVar1;
    local_248.m_backend.data._M_elems[5] = puVar1[1];
    local_248.m_backend.data._M_elems[6] = puVar1[2];
    local_248.m_backend.data._M_elems[7] = puVar1[3];
    local_248.m_backend.exp = pnVar3[j].m_backend.exp;
    local_248.m_backend.neg = pnVar3[j].m_backend.neg;
    local_248.m_backend.fpclass = pnVar3[j].m_backend.fpclass;
    local_248.m_backend.prec_elem = pnVar3[j].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_98,this);
    bVar4 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_208,&local_248,&local_98);
    if (bVar4) {
      VVar7 = ON_LOWER;
    }
    else {
      local_288.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8)
      ;
      local_288.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_288.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_288.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4)
      ;
      local_288.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6)
      ;
      local_288.m_backend.exp = (val->m_backend).exp;
      local_288.m_backend.neg = (val->m_backend).neg;
      local_288.m_backend.fpclass = (val->m_backend).fpclass;
      local_288.m_backend.prec_elem = (val->m_backend).prec_elem;
      pnVar3 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar3[j].m_backend.data._M_elems + 8);
      pnVar2 = pnVar3 + j;
      local_2c8.m_backend.data._M_elems[0] = (pnVar2->m_backend).data._M_elems[0];
      local_2c8.m_backend.data._M_elems[1] = (pnVar2->m_backend).data._M_elems[1];
      local_2c8.m_backend.data._M_elems[2] = (pnVar2->m_backend).data._M_elems[2];
      local_2c8.m_backend.data._M_elems[3] = (pnVar2->m_backend).data._M_elems[3];
      puVar1 = pnVar3[j].m_backend.data._M_elems + 4;
      local_2c8.m_backend.data._M_elems[4] = *puVar1;
      local_2c8.m_backend.data._M_elems[5] = puVar1[1];
      local_2c8.m_backend.data._M_elems[6] = puVar1[2];
      local_2c8.m_backend.data._M_elems[7] = puVar1[3];
      local_2c8.m_backend.exp = pnVar3[j].m_backend.exp;
      local_2c8.m_backend.neg = pnVar3[j].m_backend.neg;
      local_2c8.m_backend.fpclass = pnVar3[j].m_backend.fpclass;
      local_2c8.m_backend.prec_elem = pnVar3[j].m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_d0,this);
      bVar4 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_288,&local_2c8,&local_d0);
      VVar7 = ON_UPPER;
      if (!bVar4) {
        pnVar2 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_140,-*pdVar6,(type *)0x0);
        tVar5 = boost::multiprecision::operator<=
                          (pnVar2 + j,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_140);
        if (tVar5) {
          pnVar2 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar6 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_108,*pdVar6,(type *)0x0);
          tVar5 = boost::multiprecision::operator>=
                            (pnVar2 + j,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_108);
          if (tVar5) {
            VVar7 = ZERO;
            goto LAB_002abe75;
          }
        }
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_140,"XMAISM14 This should never happen.",(allocator *)&local_108
                  );
        SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&local_140);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
    }
  }
LAB_002abe75:
  this->m_status = VVar7;
  return;
}

Assistant:

FixBoundsPS(const SPxLPBase<R>& lp, int j, R val, std::shared_ptr<Tolerances> tols)
         : PostStep("FixBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
      {
         if(EQrel(lp.lower(j), lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::FIXED;
         else if(EQrel(val, lp.lower(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_LOWER;
         else if(EQrel(val, lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_UPPER;
         else if(lp.lower(j) <= R(-infinity) && lp.upper(j) >= R(infinity))
            m_status = SPxSolverBase<R>::ZERO;
         else
         {
            throw SPxInternalCodeException("XMAISM14 This should never happen.");
         }
      }